

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_uuencode.c
# Opt level: O1

void uu_encode(archive_string *as,uchar *p,size_t len)

{
  char cVar1;
  byte bVar2;
  
  cVar1 = (char)len + ' ';
  if ((int)len == 0) {
    cVar1 = '`';
  }
  archive_strappend_char(as,cVar1);
  if (2 < len) {
    do {
      cVar1 = (*p >> 2) + 0x20;
      if (*p < 4) {
        cVar1 = '`';
      }
      archive_strappend_char(as,cVar1);
      bVar2 = (*p & 3) << 4 | p[1] >> 4;
      cVar1 = bVar2 + 0x20;
      if (bVar2 == 0) {
        cVar1 = '`';
      }
      archive_strappend_char(as,cVar1);
      bVar2 = (p[1] & 0xf) << 2 | p[2] >> 6;
      cVar1 = bVar2 + 0x20;
      if (bVar2 == 0) {
        cVar1 = '`';
      }
      archive_strappend_char(as,cVar1);
      cVar1 = (p[2] & 0x3f) + 0x20;
      if ((p[2] & 0x3f) == 0) {
        cVar1 = '`';
      }
      archive_strappend_char(as,cVar1);
      p = p + 3;
      len = len - 3;
    } while (2 < len);
  }
  if (len != 0) {
    cVar1 = (*p >> 2) + 0x20;
    if (*p < 4) {
      cVar1 = '`';
    }
    archive_strappend_char(as,cVar1);
    bVar2 = (*p & 3) * '\x10';
    if (len == 1) {
      cVar1 = bVar2 + 0x20;
      if ((*p & 3) == 0) {
        cVar1 = '`';
      }
      archive_strappend_char(as,cVar1);
      cVar1 = '`';
    }
    else {
      bVar2 = p[1] >> 4 | bVar2;
      cVar1 = bVar2 + 0x20;
      if (bVar2 == 0) {
        cVar1 = '`';
      }
      archive_strappend_char(as,cVar1);
      cVar1 = (p[1] & 0xf) * '\x04' + ' ';
      if ((p[1] & 0xf) == 0) {
        cVar1 = '`';
      }
    }
    archive_strappend_char(as,cVar1);
    archive_strappend_char(as,'`');
  }
  archive_strappend_char(as,'\n');
  return;
}

Assistant:

static void
uu_encode(struct archive_string *as, const unsigned char *p, size_t len)
{
	int c;

	c = (int)len;
	archive_strappend_char(as, c?c + 0x20:'`');
	for (; len >= 3; p += 3, len -= 3) {
		c = p[0] >> 2;
		archive_strappend_char(as, c?c + 0x20:'`');
		c = ((p[0] & 0x03) << 4) | ((p[1] & 0xf0) >> 4);
		archive_strappend_char(as, c?c + 0x20:'`');
		c = ((p[1] & 0x0f) << 2) | ((p[2] & 0xc0) >> 6);
		archive_strappend_char(as, c?c + 0x20:'`');
		c = p[2] & 0x3f;
		archive_strappend_char(as, c?c + 0x20:'`');
	}
	if (len > 0) {
		c = p[0] >> 2;
		archive_strappend_char(as, c?c + 0x20:'`');
		c = (p[0] & 0x03) << 4;
		if (len == 1) {
			archive_strappend_char(as, c?c + 0x20:'`');
			archive_strappend_char(as, '`');
			archive_strappend_char(as, '`');
		} else {
			c |= (p[1] & 0xf0) >> 4;
			archive_strappend_char(as, c?c + 0x20:'`');
			c = (p[1] & 0x0f) << 2;
			archive_strappend_char(as, c?c + 0x20:'`');
			archive_strappend_char(as, '`');
		}
	}
	archive_strappend_char(as, '\n');
}